

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _dequeIterator.hpp
# Opt level: O0

dequeIterator<int,_64UL> * __thiscall
ft::dequeIterator<int,_64UL>::operator+=(dequeIterator<int,_64UL> *this,difference_type rhs)

{
  pointer pvVar1;
  long lVar2;
  size_type sVar3;
  long local_28;
  difference_type node_offset;
  difference_type offset;
  difference_type rhs_local;
  dequeIterator<int,_64UL> *this_local;
  
  lVar2 = rhs + ((long)this->m_cur - (long)this->m_first >> 2);
  if ((-1 < lVar2) && (sVar3 = chunk_size(this), lVar2 < (long)sVar3)) {
    this->m_cur = this->m_cur + rhs;
    return this;
  }
  if (lVar2 < 1) {
    sVar3 = chunk_size(this);
    local_28 = -1 - (-1 - lVar2) / (long)sVar3;
  }
  else {
    sVar3 = chunk_size(this);
    local_28 = lVar2 / (long)sVar3;
  }
  setNode(this,this->m_node + local_28);
  pvVar1 = this->m_first;
  sVar3 = chunk_size(this);
  this->m_cur = pvVar1 + (lVar2 - local_28 * sVar3);
  return this;
}

Assistant:

dequeIterator&	operator+=(difference_type rhs) {
		difference_type	offset = rhs + (this->m_cur - this->m_first);
		if (offset >= 0 && offset < difference_type(this->chunk_size()))
			this->m_cur += rhs;
		else {
			difference_type	node_offset;
			if (offset > 0) node_offset = offset / difference_type(this->chunk_size());
			else node_offset = -((-offset - 1) / difference_type(this->chunk_size())) -1;

			this->setNode(this->m_node + node_offset);
			this->m_cur = this->m_first + (offset - node_offset * this->chunk_size());
		}
		return *this;
	}